

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O2

void transwarp::detail::
     call_with_each_index<3ul,4ul,5ul,6ul,7ul,transwarp::detail::visit_depth_visitor,std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>
               (undefined8 *param_1,long param_2)

{
  invalid_parameter *this;
  allocator local_51;
  __tuple_element_t<3UL,_tuple<shared_ptr<task<tuple<basic_string<char>,_int,_int>_>_>,_shared_ptr<task<vector<RefData,_allocator<RefData>_>_>_>,_shared_ptr<task<map<basic_string<char>,_int,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_int>_>_>_>_>,_shared_ptr<task<int>_>,_shared_ptr<task<bool>_>,_shared_ptr<task<map<basic_string<char>,_vector<pair<long,_long>,_allocator<pair<long,_long>_>_>,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_vector<pair<long,_long>,_allocator<pair<long,_long>_>_>_>_>_>_>_>,_shared_ptr<task<basic_string<char>_>_>,_shared_ptr<task<basic_string<char>_>_>_>_>
  ptr;
  string local_40;
  
  std::__shared_ptr<transwarp::task<int>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&ptr.super___shared_ptr<transwarp::task<int>,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<transwarp::task<int>,_(__gnu_cxx::_Lock_policy)2> *)(param_2 + 0x40));
  if (ptr.super___shared_ptr<transwarp::task<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    (*((ptr.super___shared_ptr<transwarp::task<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_itask)._vptr_itask[0x32])
              (ptr.super___shared_ptr<transwarp::task<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               *param_1);
    call_with_each_index<4ul,5ul,6ul,7ul,transwarp::detail::visit_depth_visitor,std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>
              (param_1,param_2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ptr.super___shared_ptr<transwarp::task<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    return;
  }
  this = (invalid_parameter *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_40,"task pointer",&local_51);
  invalid_parameter::invalid_parameter(this,&local_40);
  __cxa_throw(this,&invalid_parameter::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void call_with_each_index(transwarp::detail::indices<i, j...>, const Functor& f, const std::tuple<std::shared_ptr<transwarp::task<ParentResults>>...>& t) {
    auto ptr = std::get<i>(t);
    if (!ptr) {
        throw transwarp::invalid_parameter("task pointer");
    }
    f(*ptr);
    transwarp::detail::call_with_each_index(transwarp::detail::indices<j...>(), f, t);
}